

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolver.h
# Opt level: O0

void __thiscall
Eigen::
TriangularViewImpl<Eigen::Transpose<Eigen::SparseMatrix<double,0,int>const>const,6u,Eigen::Sparse>::
solveInPlace<Eigen::Matrix<double,_1,1,0,_1,1>>
          (TriangularViewImpl<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U,_Eigen::Sparse>
           *this,MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *other)

{
  TriangularView<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U> *this_00;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  SparseMatrixBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U>_>
  *in_RDI;
  OtherCopy otherCopy;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_00000088;
  Transpose<const_Eigen::SparseMatrix<double,_0,_int>_> *in_stack_00000090;
  
  EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::derived(in_RSI);
  this_00 = SparseMatrixBase<Eigen::TriangularView<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U>_>
            ::derived(in_RDI);
  TriangularView<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_6U>::
  nestedExpression(this_00);
  internal::
  sparse_solve_triangular_selector<const_Eigen::Transpose<const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_6,_2,_1>
  ::run(in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

void TriangularViewImpl<ExpressionType,Mode,Sparse>::solveInPlace(MatrixBase<OtherDerived>& other) const
{
  eigen_assert(derived().cols() == derived().rows() && derived().cols() == other.rows());
  eigen_assert((!(Mode & ZeroDiag)) && bool(Mode & (Upper|Lower)));

  enum { copy = internal::traits<OtherDerived>::Flags & RowMajorBit };

  typedef typename internal::conditional<copy,
    typename internal::plain_matrix_type_column_major<OtherDerived>::type, OtherDerived&>::type OtherCopy;
  OtherCopy otherCopy(other.derived());

  internal::sparse_solve_triangular_selector<ExpressionType, typename internal::remove_reference<OtherCopy>::type, Mode>::run(derived().nestedExpression(), otherCopy);

  if (copy)
    other = otherCopy;
}